

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::setRootIndex(QTableView *this,QModelIndex *index)

{
  bool bVar1;
  QTableViewPrivate *pQVar2;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  QTableViewPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  QModelIndex *this_00;
  
  this_00 = in_RDI;
  pQVar2 = d_func((QTableView *)0x8b5e41);
  bVar1 = ::operator==(in_RDI,(QPersistentModelIndex *)in_stack_ffffffffffffffd8);
  if (bVar1) {
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  else {
    (**(code **)(*(long *)&(pQVar2->verticalHeader->super_QAbstractItemView).
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x218))
              (pQVar2->verticalHeader,in_RSI);
    (**(code **)(*(long *)&(pQVar2->horizontalHeader->super_QAbstractItemView).
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x218))
              (pQVar2->horizontalHeader,in_RSI);
    QAbstractItemView::setRootIndex((QAbstractItemView *)this_00,in_RSI);
  }
  return;
}

Assistant:

void QTableView::setRootIndex(const QModelIndex &index)
{
    Q_D(QTableView);
    if (index == d->root) {
        viewport()->update();
        return;
    }
    d->verticalHeader->setRootIndex(index);
    d->horizontalHeader->setRootIndex(index);
    QAbstractItemView::setRootIndex(index);
}